

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

CFeeRate wallet::GetMinimumFeeRate
                   (CWallet *wallet,CCoinControl *coin_control,FeeCalculation *feeCalc)

{
  long lVar1;
  Chain *pCVar2;
  FeeReason FVar3;
  optional<unsigned_int> *poVar4;
  _Storage<CFeeRate,_true> _Var5;
  undefined4 extraout_var_00;
  _Storage<CFeeRate,_true> _Var6;
  CFeeRate CVar7;
  byte bVar8;
  optional<bool> *poVar9;
  long in_FS_OFFSET;
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    _Var5 = (coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_payload;
    if (feeCalc != (FeeCalculation *)0x0) {
      feeCalc->reason = PAYTXFEE;
    }
    if (coin_control->fOverrideFeeRate == false) goto LAB_00567ad0;
  }
  else {
    if ((coin_control->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      _Var6 = (_Storage<CFeeRate,_true>)(wallet->m_pay_tx_fee).nSatoshisPerK;
      if (_Var6 == (_Storage<CFeeRate,_true>)0x0) {
        poVar4 = (optional<unsigned_int> *)&wallet->m_confirm_target;
        goto LAB_00567a2d;
      }
      FVar3 = PAYTXFEE;
      if (feeCalc == (FeeCalculation *)0x0) {
        CVar7 = GetRequiredFeeRate(wallet);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          if (CVar7.nSatoshisPerK <= (long)_Var6) {
            return (CFeeRate)_Var6;
          }
          return (CFeeRate)CVar7.nSatoshisPerK;
        }
        goto LAB_00567b32;
      }
    }
    else {
      poVar4 = &coin_control->m_confirm_target;
LAB_00567a2d:
      bVar8 = 1;
      if (coin_control->m_fee_mode != CONSERVATIVE) {
        poVar9 = (optional<bool> *)&wallet->m_signal_rbf;
        if ((coin_control->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != false) {
          poVar9 = &coin_control->m_signal_bip125_rbf;
        }
        bVar8 = coin_control->m_fee_mode != ECONOMICAL &
                ((poVar9->super__Optional_base<bool,_true,_true>)._M_payload.
                 super__Optional_payload_base<bool>._M_payload._M_value ^ 1U);
      }
      pCVar2 = wallet->m_chain;
      if (pCVar2 == (Chain *)0x0) goto LAB_00567b37;
      _Var5._0_4_ = (*pCVar2->_vptr_Chain[0x1b])
                              (pCVar2,(ulong)(poVar4->super__Optional_base<unsigned_int,_true,_true>
                                             )._M_payload.super__Optional_payload_base<unsigned_int>
                                             ._M_payload._M_value,(ulong)bVar8,feeCalc);
      _Var5._M_value.nSatoshisPerK._4_4_ = extraout_var;
      if (_Var5 == (_Storage<CFeeRate,_true>)0x0) {
        _Var5 = (_Storage<CFeeRate,_true>)(wallet->m_fallback_fee).nSatoshisPerK;
        if (feeCalc != (FeeCalculation *)0x0) {
          feeCalc->reason = FALLBACK;
        }
        if (_Var5 == (_Storage<CFeeRate,_true>)0x0) {
          _Var5 = (_Storage<CFeeRate,_true>)0x0;
          goto LAB_00567aec;
        }
      }
      if (wallet->m_chain == (Chain *)0x0) {
LAB_00567b37:
        __assert_fail("m_chain",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
      }
      _Var6._0_4_ = (*wallet->m_chain->_vptr_Chain[0x1d])();
      _Var6._M_value.nSatoshisPerK._4_4_ = extraout_var_00;
      if ((long)_Var6 <= (long)_Var5) goto LAB_00567ad0;
      if (feeCalc == (FeeCalculation *)0x0) {
        CVar7 = GetRequiredFeeRate(wallet);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          if (CVar7.nSatoshisPerK <= (long)_Var6) {
            return (CFeeRate)_Var6;
          }
          return (CFeeRate)CVar7.nSatoshisPerK;
        }
        goto LAB_00567b32;
      }
      FVar3 = MEMPOOL_MIN;
    }
    feeCalc->reason = FVar3;
    _Var5 = _Var6;
LAB_00567ad0:
    _Var6._M_value = GetRequiredFeeRate(wallet);
    if (((long)_Var5 < (long)_Var6) &&
       (_Var5._M_value.nSatoshisPerK = _Var6._M_value.nSatoshisPerK,
       feeCalc != (FeeCalculation *)0x0)) {
      feeCalc->reason = REQUIRED;
    }
  }
LAB_00567aec:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CFeeRate)_Var5;
  }
LAB_00567b32:
  __stack_chk_fail();
}

Assistant:

CFeeRate GetMinimumFeeRate(const CWallet& wallet, const CCoinControl& coin_control, FeeCalculation* feeCalc)
{
    /* User control of how to calculate fee uses the following parameter precedence:
       1. coin_control.m_feerate
       2. coin_control.m_confirm_target
       3. m_pay_tx_fee (user-set member variable of wallet)
       4. m_confirm_target (user-set member variable of wallet)
       The first parameter that is set is used.
    */
    CFeeRate feerate_needed;
    if (coin_control.m_feerate) { // 1.
        feerate_needed = *(coin_control.m_feerate);
        if (feeCalc) feeCalc->reason = FeeReason::PAYTXFEE;
        // Allow to override automatic min/max check over coin control instance
        if (coin_control.fOverrideFeeRate) return feerate_needed;
    }
    else if (!coin_control.m_confirm_target && wallet.m_pay_tx_fee != CFeeRate(0)) { // 3. TODO: remove magic value of 0 for wallet member m_pay_tx_fee
        feerate_needed = wallet.m_pay_tx_fee;
        if (feeCalc) feeCalc->reason = FeeReason::PAYTXFEE;
    }
    else { // 2. or 4.
        // We will use smart fee estimation
        unsigned int target = coin_control.m_confirm_target ? *coin_control.m_confirm_target : wallet.m_confirm_target;
        // By default estimates are economical iff we are signaling opt-in-RBF
        bool conservative_estimate = !coin_control.m_signal_bip125_rbf.value_or(wallet.m_signal_rbf);
        // Allow to override the default fee estimate mode over the CoinControl instance
        if (coin_control.m_fee_mode == FeeEstimateMode::CONSERVATIVE) conservative_estimate = true;
        else if (coin_control.m_fee_mode == FeeEstimateMode::ECONOMICAL) conservative_estimate = false;

        feerate_needed = wallet.chain().estimateSmartFee(target, conservative_estimate, feeCalc);
        if (feerate_needed == CFeeRate(0)) {
            // if we don't have enough data for estimateSmartFee, then use fallback fee
            feerate_needed = wallet.m_fallback_fee;
            if (feeCalc) feeCalc->reason = FeeReason::FALLBACK;

            // directly return if fallback fee is disabled (feerate 0 == disabled)
            if (wallet.m_fallback_fee == CFeeRate(0)) return feerate_needed;
        }
        // Obey mempool min fee when using smart fee estimation
        CFeeRate min_mempool_feerate = wallet.chain().mempoolMinFee();
        if (feerate_needed < min_mempool_feerate) {
            feerate_needed = min_mempool_feerate;
            if (feeCalc) feeCalc->reason = FeeReason::MEMPOOL_MIN;
        }
    }

    // prevent user from paying a fee below the required fee rate
    CFeeRate required_feerate = GetRequiredFeeRate(wallet);
    if (required_feerate > feerate_needed) {
        feerate_needed = required_feerate;
        if (feeCalc) feeCalc->reason = FeeReason::REQUIRED;
    }
    return feerate_needed;
}